

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void __thiscall
wasm_module_t::wasm_module_t
          (wasm_module_t *this,RefPtr<wabt::interp::Module> *ptr,wasm_byte_vec_t *in)

{
  RefPtr<wabt::interp::Object> local_38;
  wasm_byte_vec_t *local_20;
  wasm_byte_vec_t *in_local;
  RefPtr<wabt::interp::Module> *ptr_local;
  wasm_module_t *this_local;
  
  local_20 = in;
  in_local = (wasm_byte_vec_t *)ptr;
  ptr_local = (RefPtr<wabt::interp::Module> *)this;
  wabt::interp::RefPtr<wabt::interp::Object>::RefPtr<wabt::interp::Module>(&local_38,ptr);
  wasm_ref_t::wasm_ref_t(&this->super_wasm_ref_t,&local_38);
  wabt::interp::RefPtr<wabt::interp::Object>::~RefPtr(&local_38);
  wasm_byte_vec_copy(&this->binary,local_20);
  return;
}

Assistant:

wasm_module_t(RefPtr<Module> ptr, const wasm_byte_vec_t* in)
      : wasm_ref_t(ptr) {
    wasm_byte_vec_copy(&binary, in);
  }